

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> * __thiscall
nonius::execution_plan::operator_cast_to_execution_plan
          (execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
           *__return_storage_ptr__,execution_plan *this)

{
  int iterations_per_sample;
  pointer *__ptr;
  __alloc_node_gen_t __alloc_node_gen;
  benchmark_function local_68;
  double local_60;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>_>_>
  local_58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_50;
  
  iterations_per_sample = *(int *)this;
  local_60 = *(double *)(this + 8);
  local_58._M_h = (__hashtable_alloc *)&local_50;
  local_50._M_buckets = (__buckets_ptr)0x0;
  local_50._M_bucket_count = *(size_type *)(this + 0x18);
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = *(size_type *)(this + 0x28);
  local_50._M_rehash_policy._0_8_ = *(undefined8 *)(this + 0x30);
  local_50._M_rehash_policy._M_next_resize = *(size_t *)(this + 0x38);
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,nonius::param>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_58._M_h,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)(this + 0x10),&local_58);
  local_68.f._M_t.
  super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  ._M_t.
  super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl =
       (unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
        )(**(code **)(**(long **)(this + 0x48) + 0x10))();
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::execution_plan
            (__return_storage_ptr__,iterations_per_sample,
             (duration<double,_std::ratio<1L,_1L>_>)(local_60 * 1e-09),(parameters *)&local_50,
             &local_68,(duration<double,_std::ratio<1L,_1L>_>)(*(double *)(this + 0x50) * 1e-09),
             *(int *)(this + 0x58));
  if (local_68.f._M_t.
      super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
      ._M_t.
      super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
      .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl !=
      (__uniq_ptr_data<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_68.f._M_t.
                          super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                          .
                          super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>
                          ._M_head_impl + 0x20))();
  }
  local_68.f._M_t.
  super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  ._M_t.
  super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl =
       (unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
        )(__uniq_ptr_data<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>,_true,_true>
          )0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_50);
  return __return_storage_ptr__;
}

Assistant:

operator execution_plan<Duration2>() const {
            return execution_plan<Duration2>{ iterations_per_sample, estimated_duration, params, benchmark, warmup_time, warmup_iterations };
        }